

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer.cc
# Opt level: O0

void prometheus::anon_unknown_5::WriteValue(ostream *out,double value)

{
  uint uVar1;
  char *local_28;
  double value_local;
  ostream *out_local;
  
  uVar1 = std::isnan(value);
  if ((uVar1 & 1) == 0) {
    uVar1 = std::isinf(value);
    if ((uVar1 & 1) == 0) {
      std::ostream::operator<<(out,value);
    }
    else {
      if (0.0 <= value) {
        local_28 = "+Inf";
      }
      else {
        local_28 = "-Inf";
      }
      std::operator<<(out,local_28);
    }
  }
  else {
    std::operator<<(out,"Nan");
  }
  return;
}

Assistant:

void WriteValue(std::ostream& out, double value) {
  if (std::isnan(value)) {
    out << "Nan";
  } else if (std::isinf(value)) {
    out << (value < 0 ? "-Inf" : "+Inf");
  } else {
    out << value;
  }
}